

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TStdExtension.cpp
# Opt level: O0

void __thiscall StdOutbound_Test1_Test::TestBody(StdOutbound_Test1_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_6e8;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_1;
  ifstream ifs2;
  string local_4c0;
  AssertHelper local_4a0;
  Message local_498;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_;
  ofstream ofs;
  char *local_278;
  char *outFileName;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  undefined1 local_238 [8];
  string s;
  ifstream ifs;
  StdOutbound_Test1_Test *this_local;
  
  std::ifstream::ifstream
            ((ifstream *)(s.field_2._M_local_buf + 8),"../test/testdata/StdExtension.data",8);
  std::__cxx11::string::string((string *)local_238);
  std::operator<<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                  (ifstream *)(s.field_2._M_local_buf + 8));
  testing::internal::EqHelper::
  Compare<char[41],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_258,"\"key1 = val1\\n##this is comment\\nkey2=val2\\n\"","s",
             (char (*) [41])"key1 = val1\n##this is comment\nkey2=val2\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
               ,0xc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  outFileName._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  if (outFileName._4_4_ == 0) {
    local_278 = "stdoutbuond.test.tmp";
    std::ofstream::ofstream(&gtest_ar_.message_,"stdoutbuond.test.tmp",0x10);
    std::__cxx11::string::operator=((string *)local_238,local_278);
    std::operator<<((ofstream *)&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    bVar2 = std::ios::operator!((ios *)((long)&gtest_ar_.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + *(long *)((long)gtest_ar_.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + -0x18)));
    local_489 = (bool)(~bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_488,&local_489,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4c0,(internal *)local_488,(AssertionResult *)"!!ofs","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                 ,0x12,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      testing::Message::~Message(&local_498);
    }
    outFileName._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
    if (outFileName._4_4_ == 0) {
      std::ofstream::close();
      std::ifstream::ifstream(&gtest_ar_1.message_,local_278,8);
      std::operator<<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238
                      ,(ifstream *)&gtest_ar_1.message_);
      testing::internal::EqHelper::
      Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_6d8,"outFileName","s",&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
      if (!bVar1) {
        testing::Message::Message(&local_6e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                   ,0x17,pcVar3);
        testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
        testing::internal::AssertHelper::~AssertHelper(&local_6e8);
        testing::Message::~Message(&local_6e0);
      }
      outFileName._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
      if (outFileName._4_4_ == 0) {
        outFileName._4_4_ = 0;
      }
      std::ifstream::~ifstream(&gtest_ar_1.message_);
    }
    std::ofstream::~ofstream(&gtest_ar_.message_);
  }
  std::__cxx11::string::~string((string *)local_238);
  std::ifstream::~ifstream((void *)((long)&s.field_2 + 8));
  return;
}

Assistant:

TEST(StdOutbound, Test1) {
  ifstream ifs("../test/testdata/StdExtension.data");
  string s;
  s << ifs;
  ASSERT_EQ("key1 = val1\n##this is comment\nkey2=val2\n", s);

  const char * outFileName = "stdoutbuond.test.tmp";
  ofstream ofs(outFileName);
  s = outFileName;
  ofs << s;
  ASSERT_TRUE(!!ofs);
  ofs.close();

  ifstream ifs2(outFileName);
  s << ifs2;
  ASSERT_EQ(outFileName, s);
}